

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O3

int ffpcln(fitsfile *fptr,int ncols,int *datatype,int *colnum,LONGLONG firstrow,LONGLONG nrows,
          void **array,void **nulval,int *status)

{
  long *__ptr;
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int typecode;
  ulong local_8c0;
  ulong local_8b8;
  long nrowbuf;
  LONGLONG width;
  LONGLONG ntotrows;
  LONGLONG repeat;
  size_t sizes [255];
  
  uVar4 = (ulong)(uint)ncols;
  memset(sizes,0,0x7f8);
  sizes[0xe] = 1;
  sizes[0xc] = 1;
  sizes[0xb] = 1;
  sizes[0x15] = 2;
  sizes[0x14] = 2;
  sizes[0x1e] = 4;
  sizes[0x1f] = 4;
  sizes[0x28] = 8;
  sizes[0x29] = 8;
  sizes[0x50] = 8;
  sizes[0x51] = 8;
  sizes[0x2a] = 4;
  sizes[0x52] = 8;
  sizes[0xa3] = 0x10;
  iVar7 = *status;
  if (iVar7 < 1) {
    if (ncols < 1) {
      *status = 0;
      iVar7 = 0;
    }
    else {
      local_8b8 = uVar4;
      __ptr = (long *)malloc(uVar4 * 8);
      if (__ptr == (long *)0x0) {
        *status = 0x71;
        iVar7 = 0x71;
      }
      else {
        ffgnrwll(fptr,&ntotrows,status);
        ffgrsz(fptr,&nrowbuf,status);
        uVar3 = 999;
        if (ncols - 1U < 999) {
          uVar3 = ncols - 1U;
        }
        uVar6 = 0;
        local_8c0 = uVar4;
        do {
          ffgtclll(fptr,colnum[uVar6],&typecode,&repeat,&width,status);
          __ptr[uVar6] = repeat;
          iVar7 = datatype[uVar6];
          if ((((long)iVar7 == 1) || (iVar7 == 0x10)) || (sizes[iVar7] == 0)) {
            ffpmsg("Cannot write to TBIT or TSTRING datatypes (ffpcln)");
            *status = 0x19a;
          }
          if (typecode < 0) {
            ffpmsg("Cannot write to variable-length data (ffpcln)");
            *status = 0x140;
            iVar7 = 0x140;
            goto LAB_0019d05d;
          }
          iVar7 = *status;
          if (iVar7 != 0) goto LAB_0019d05d;
          uVar6 = uVar6 + 1;
        } while (uVar3 + 1 != uVar6);
        if ((int)local_8c0 == 1) {
          ffpcn(fptr,*datatype,*colnum,firstrow,1,nrows * *__ptr,*array,*nulval,status);
          free(__ptr);
          iVar7 = *status;
        }
        else {
          lVar5 = 0;
          do {
            lVar1 = nrows - lVar5;
            if (lVar1 == 0 || nrows < lVar5) {
              iVar7 = 0;
              break;
            }
            lVar2 = nrowbuf;
            if (lVar1 < nrowbuf) {
              lVar2 = lVar1;
            }
            uVar4 = 0;
            do {
              ffpcn(fptr,datatype[uVar4],colnum[uVar4],lVar5 + 1,1,__ptr[uVar4] * lVar2,
                    (void *)(__ptr[uVar4] * lVar5 * sizes[datatype[uVar4]] + (long)array[uVar4]),
                    nulval[uVar4],status);
              if (*status != 0) {
                sprintf((char *)&repeat,"Failed to write column %d data rows %lld-%lld (ffpcln)",
                        (ulong)(uint)colnum[uVar4],firstrow,firstrow + lVar2 + -1);
                ffpmsg((char *)&repeat);
                iVar7 = *status;
                goto LAB_0019d187;
              }
              uVar4 = uVar4 + 1;
            } while (local_8b8 != uVar4);
            iVar7 = 0;
LAB_0019d187:
            firstrow = firstrow + lVar2;
            lVar5 = lVar5 + lVar2;
          } while (iVar7 == 0);
LAB_0019d05d:
          free(__ptr);
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int ffpcln( fitsfile *fptr,   /* I - FITS file pointer                       */
	    int ncols,        /* I - number of columns to write              */
            int  *datatype,   /* I - datatypes of the values                 */
            int  *colnum,     /* I - columns numbers to write (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to write (1 = 1st row)    */
            LONGLONG nrows,       /* I - number of rows to write             */
            void **array,     /* I - array of pointers to values to write    */
            void **nulval,    /* I - array of pointers to values for undefined pixels */
            int  *status)     /* IO - error status                           */
/*
  Write arrays of values to NCOLS table columns. This is an optimization
  to write all columns in one pass through the table.  The datatypes of the
  input arrays are defined by the 3rd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
  Undefined elements for column i that are equal to *(nulval[i]) are set to
  the defined null value, unless nulval[i]=0,
  in which case no checking for undefined values will be performed.
*/
{
    LONGLONG ntotrows, ndone, nwrite, currow;
    long nrowbuf;
    LONGLONG *repeats = 0;
    size_t sizes[255] = {0};
    int icol;

    sizes[TBYTE] = sizes[TSBYTE] = sizes[TLOGICAL] = sizeof(char);
    sizes[TUSHORT] = sizes[TSHORT] = sizeof(short int);
    sizes[TINT] = sizes[TUINT] = sizeof(int);
    sizes[TLONG] = sizes[TULONG] = sizeof(long int);
    sizes[TLONGLONG] = sizes[TULONGLONG] = sizeof(LONGLONG);
    sizes[TFLOAT] = sizeof(float);
    sizes[TDOUBLE] = sizeof(double);
    sizes[TDBLCOMPLEX] = 2*sizeof(double);

    if (*status > 0)
        return(*status);

    if (ncols <= 0) return (*status=0);

    repeats = malloc(sizeof(LONGLONG)*ncols);
    if (repeats == 0) return (*status=MEMORY_ALLOCATION);

    fits_get_num_rowsll(fptr, &ntotrows, status);
    fits_get_rowsize(fptr, &nrowbuf, status);

    /* Retrieve column repeats */
    for (icol = 0; (icol < ncols) && (icol < 1000); icol++) {
      int typecode;
      LONGLONG repeat, width;
      fits_get_coltypell(fptr, colnum[icol], &typecode, 
			 &repeat, &width, status);
      repeats[icol] = repeat;

      if (datatype[icol] == TBIT || datatype[icol] == TSTRING ||
	  sizes[datatype[icol]] == 0) {
	ffpmsg("Cannot write to TBIT or TSTRING datatypes (ffpcln)");
	*status = BAD_DATATYPE;
      }
      if (typecode < 0) {
	ffpmsg("Cannot write to variable-length data (ffpcln)");
	*status = BAD_DIMEN;
      }

      if (*status) break;
    }
    if (*status) {
      free(repeats);
      return *status;
    }

    /* Optimize for 1 column */
    if (ncols == 1) {
      fits_write_colnull(fptr, datatype[0], colnum[0], firstrow, 1,
			 nrows*repeats[0], 
			 array[0], nulval[0], status);
      free(repeats);
      return *status;
    }

    /* Scan through file, in chunks of nrowbuf */
    currow = firstrow;
    ndone = 0;
    while (ndone < nrows) {
      int icol;
      nwrite = (nrows-ndone);
      if (nwrite > nrowbuf) nwrite = nrowbuf;

      for (icol=0; icol<ncols; icol++) {
	LONGLONG nelem1 = (nwrite*repeats[icol]);
	char *array1 = (char *) array[icol] + repeats[icol]*ndone*sizes[datatype[icol]];

	fits_write_colnull(fptr, datatype[icol], colnum[icol], ndone+1, 1, 
			   nelem1, array1, nulval[icol], status);
	if (*status) {
	  char errmsg[100];
	  sprintf(errmsg,
		  "Failed to write column %d data rows %lld-%lld (ffpcln)",
		  colnum[icol], currow, currow+nwrite-1);
	  ffpmsg(errmsg);
	  break;
	}
      }

      if (*status) break;
      currow += nwrite;
      ndone += nwrite;
    }

    free(repeats);
    return *status;
}